

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

BOOL SetFileAttributesW(LPCWSTR lpFileName,DWORD dwFileAttributes)

{
  undefined8 lpFileName_00;
  BOOL BVar1;
  DWORD DVar2;
  void *pvVar3;
  size_t sVar4;
  int *piVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined1 local_78 [8];
  PathCharString namePS;
  
  namePS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  namePS._32_8_ = local_78;
  namePS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002be477;
  pvVar3 = pthread_getspecific(CorUnix::thObjKey);
  if (pvVar3 == (void *)0x0) {
    CreateCurrentThreadData();
  }
  if (lpFileName == (LPCWSTR)0x0) {
    iVar6 = 3;
LAB_002be43d:
    piVar5 = __errno_location();
    *piVar5 = iVar6;
    BVar1 = 0;
  }
  else {
    sVar4 = PAL_wcslen(lpFileName);
    iVar6 = ((int)sVar4 + 1) * MaxWCharToAcpLengthFactor;
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_78,(long)iVar6);
    lpFileName_00 = namePS._32_8_;
    if (namePS._32_8_ == 0) {
      iVar6 = 8;
      goto LAB_002be43d;
    }
    iVar6 = WideCharToMultiByte(0,0,lpFileName,-1,(LPSTR)namePS._32_8_,iVar6,(LPCSTR)0x0,(LPBOOL)0x0
                               );
    if ((ulong)(long)iVar6 < namePS.m_size) {
      namePS.m_size = (long)iVar6;
    }
    *(undefined1 *)(namePS._32_8_ + namePS.m_size) = 0;
    if (iVar6 == 0) {
      DVar2 = GetLastError();
      if (DVar2 == 0x7a) {
        iVar6 = 0xce;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002be477;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","SetFileAttributesW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x7d8);
        iVar6 = 0x57;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
      }
      goto LAB_002be43d;
    }
    BVar1 = SetFileAttributesA((LPCSTR)lpFileName_00,dwFileAttributes);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_78);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != namePS.m_count) {
      __stack_chk_fail();
    }
    return BVar1;
  }
LAB_002be477:
  abort();
}

Assistant:

BOOL
PALAPI
SetFileAttributesW(
           IN LPCWSTR lpFileName,
           IN DWORD dwFileAttributes)
{
    CPalThread *pThread;
    char * name;
    PathCharString namePS;
    int length = 0;
    int  size;

    DWORD dwLastError = 0;
    BOOL  bRet = FALSE;

    PERF_ENTRY(SetFileAttributesW);
    ENTRY("SetFileAttributesW(lpFileName=%p (%S), dwFileAttributes=%#x)\n",
        lpFileName?lpFileName:W16_NULLSTRING,
        lpFileName?lpFileName:W16_NULLSTRING, dwFileAttributes);
    
    pThread = InternalGetCurrentThread();
    if (lpFileName == NULL) 
    {
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }
    
    length = (PAL_wcslen(lpFileName)+1) * MaxWCharToAcpLengthFactor;
    name = namePS.OpenStringBuffer(length);
    if (NULL == name)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    size = WideCharToMultiByte( CP_ACP, 0, lpFileName, -1, name, length,
                                NULL, NULL );
    namePS.CloseBuffer(size);
    
    if( size == 0 )
    {
        dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            dwLastError = ERROR_FILENAME_EXCED_RANGE;
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            dwLastError = ERROR_INVALID_PARAMETER;
        }
        goto done;
    }
    bRet = SetFileAttributesA(name,dwFileAttributes);

done:
    if (dwLastError) pThread->SetLastError(dwLastError);

    LOGEXIT("SetFileAttributes returns BOOL %d\n", bRet);
    PERF_EXIT(SetFileAttributesW);
    return bRet;
}